

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFanio.c
# Opt level: O0

void Abc_ObjTransferFanout(Abc_Obj_t *pNodeFrom,Abc_Obj_t *pNodeTo)

{
  int iVar1;
  int iVar2;
  Vec_Ptr_t *vNodes;
  int local_28;
  int i;
  int nFanoutsOld;
  Vec_Ptr_t *vFanouts;
  Abc_Obj_t *pNodeTo_local;
  Abc_Obj_t *pNodeFrom_local;
  
  iVar1 = Abc_ObjIsComplement(pNodeFrom);
  if (iVar1 != 0) {
    __assert_fail("!Abc_ObjIsComplement(pNodeFrom)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcFanio.c"
                  ,0x128,"void Abc_ObjTransferFanout(Abc_Obj_t *, Abc_Obj_t *)");
  }
  iVar1 = Abc_ObjIsComplement(pNodeTo);
  if (iVar1 != 0) {
    __assert_fail("!Abc_ObjIsComplement(pNodeTo)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcFanio.c"
                  ,0x129,"void Abc_ObjTransferFanout(Abc_Obj_t *, Abc_Obj_t *)");
  }
  iVar1 = Abc_ObjIsPo(pNodeFrom);
  if (iVar1 == 0) {
    iVar1 = Abc_ObjIsPo(pNodeTo);
    if (iVar1 == 0) {
      if (pNodeFrom->pNtk != pNodeTo->pNtk) {
        __assert_fail("pNodeFrom->pNtk == pNodeTo->pNtk",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcFanio.c"
                      ,299,"void Abc_ObjTransferFanout(Abc_Obj_t *, Abc_Obj_t *)");
      }
      if (pNodeFrom == pNodeTo) {
        __assert_fail("pNodeFrom != pNodeTo",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcFanio.c"
                      ,300,"void Abc_ObjTransferFanout(Abc_Obj_t *, Abc_Obj_t *)");
      }
      iVar1 = Abc_ObjIsNode(pNodeFrom);
      if (iVar1 != 0) {
        iVar1 = Abc_ObjFanoutNum(pNodeFrom);
        if (iVar1 < 1) {
          __assert_fail("!Abc_ObjIsNode(pNodeFrom) || Abc_ObjFanoutNum(pNodeFrom) > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcFanio.c"
                        ,0x12d,"void Abc_ObjTransferFanout(Abc_Obj_t *, Abc_Obj_t *)");
        }
      }
      iVar1 = Abc_ObjFanoutNum(pNodeTo);
      vNodes = Vec_PtrAlloc(iVar1);
      Abc_NodeCollectFanouts(pNodeFrom,vNodes);
      for (local_28 = 0; local_28 < vNodes->nSize; local_28 = local_28 + 1) {
        Abc_ObjPatchFanin((Abc_Obj_t *)vNodes->pArray[local_28],pNodeFrom,pNodeTo);
      }
      iVar2 = Abc_ObjFanoutNum(pNodeFrom);
      if (iVar2 == 0) {
        iVar2 = Abc_ObjFanoutNum(pNodeTo);
        if (iVar2 == iVar1 + vNodes->nSize) {
          Vec_PtrFree(vNodes);
          return;
        }
        __assert_fail("Abc_ObjFanoutNum(pNodeTo) == nFanoutsOld + vFanouts->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcFanio.c"
                      ,0x136,"void Abc_ObjTransferFanout(Abc_Obj_t *, Abc_Obj_t *)");
      }
      __assert_fail("Abc_ObjFanoutNum(pNodeFrom) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcFanio.c"
                    ,0x135,"void Abc_ObjTransferFanout(Abc_Obj_t *, Abc_Obj_t *)");
    }
  }
  __assert_fail("!Abc_ObjIsPo(pNodeFrom) && !Abc_ObjIsPo(pNodeTo)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcFanio.c"
                ,0x12a,"void Abc_ObjTransferFanout(Abc_Obj_t *, Abc_Obj_t *)");
}

Assistant:

void Abc_ObjTransferFanout( Abc_Obj_t * pNodeFrom, Abc_Obj_t * pNodeTo )
{
    Vec_Ptr_t * vFanouts;
    int nFanoutsOld, i;
    assert( !Abc_ObjIsComplement(pNodeFrom) );
    assert( !Abc_ObjIsComplement(pNodeTo) );
    assert( !Abc_ObjIsPo(pNodeFrom) && !Abc_ObjIsPo(pNodeTo) );
    assert( pNodeFrom->pNtk == pNodeTo->pNtk );
    assert( pNodeFrom != pNodeTo );
    assert( !Abc_ObjIsNode(pNodeFrom) || Abc_ObjFanoutNum(pNodeFrom) > 0 );
    // get the fanouts of the old node
    nFanoutsOld = Abc_ObjFanoutNum(pNodeTo);
    vFanouts = Vec_PtrAlloc( nFanoutsOld );
    Abc_NodeCollectFanouts( pNodeFrom, vFanouts );
    // patch the fanin of each of them
    for ( i = 0; i < vFanouts->nSize; i++ )
        Abc_ObjPatchFanin( (Abc_Obj_t *)vFanouts->pArray[i], pNodeFrom, pNodeTo );
    assert( Abc_ObjFanoutNum(pNodeFrom) == 0 );
    assert( Abc_ObjFanoutNum(pNodeTo) == nFanoutsOld + vFanouts->nSize );
    Vec_PtrFree( vFanouts );
}